

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbocompression.h
# Opt level: O0

uint8_t * turbocompress64(uint64_t *in,uint32_t length,uint8_t *out)

{
  uint32_t uVar1;
  uint *in_RDX;
  uint in_ESI;
  ulong *in_RDI;
  uint32_t k;
  int b;
  uint32_t i;
  uint64_t M;
  uint64_t m;
  int local_3c;
  uint local_34;
  ulong local_30;
  ulong local_28;
  ulong *local_20;
  uint local_14;
  ulong *local_10;
  ulong *local_8;
  
  *in_RDX = in_ESI;
  local_20 = (ulong *)(in_RDX + 1);
  local_8 = local_20;
  if (in_ESI != 0) {
    local_28 = *in_RDI;
    local_30 = *in_RDI;
    for (local_34 = 1; local_34 < in_ESI; local_34 = local_34 + 1) {
      if (local_30 < in_RDI[local_34]) {
        local_30 = in_RDI[local_34];
      }
      if (in_RDI[local_34] < local_28) {
        local_28 = in_RDI[local_34];
      }
    }
    local_14 = in_ESI;
    local_10 = in_RDI;
    uVar1 = bits64(local_30 - local_28);
    *local_20 = local_28;
    local_20[1] = local_30;
    local_20 = local_20 + 2;
    for (local_3c = 0; local_3c + 0x20U <= local_14; local_3c = local_3c + 0x20) {
      (*funcForPackArr64[(int)uVar1])(local_28,&local_10,(uint8_t **)&local_20);
    }
    memcpy(local_20,local_10,(ulong)(local_14 - local_3c) << 3);
    local_8 = local_20 + (local_14 - local_3c);
  }
  return (uint8_t *)local_8;
}

Assistant:

inline uint8_t *turbocompress64(const uint64_t *in, uint32_t length,
                              uint8_t *out) {
  memcpy(out, &length, sizeof(length));
  out += sizeof(length);
  if (length == 0)
    return out;
  uint64_t m = in[0];
  uint64_t M = in[0];
  for (uint32_t i = 1; i < length; ++i) {
    if (in[i] > M)
      M = in[i];
    if (in[i] < m)
      m = in[i];
  }
  int b = bits64(static_cast<uint64_t>(M - m));
  memcpy(out, &m, sizeof(m));
  out += sizeof(m);
  memcpy(out, &M, sizeof(M));
  out += sizeof(M);

  uint32_t k = 0;
  for (; k + 32 <= length; k += 32) {
    funcForPackArr64[b](m, &in, &out);
  }
  // we could pack the rest, but we don't  bother
  memcpy(out, in, (length - k) * sizeof(uint64_t));
  out += (length - k) * sizeof(uint64_t);
  return out;
}